

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

void __thiscall SQTable::Rehash(SQTable *this,bool force)

{
  _HashNode *p;
  ulong uVar1;
  ulong uVar2;
  _HashNode *this_00;
  SQObjectPtr *key;
  ulong uVar3;
  
  p = this->_nodes;
  uVar2 = this->_numofnodes;
  uVar1 = 4;
  if (4 < (long)uVar2) {
    uVar1 = uVar2;
  }
  if (this->_usednodes < (long)(uVar1 - (uVar1 >> 2))) {
    if ((long)uVar2 < 5 || (long)(uVar1 >> 2) < this->_usednodes) {
      uVar2 = uVar1;
      if (!force) {
        return;
      }
    }
    else {
      uVar2 = uVar1 >> 1;
    }
  }
  else {
    uVar2 = uVar1 * 2;
  }
  AllocNodes(this,uVar2);
  this->_usednodes = 0;
  key = &p->key;
  uVar2 = uVar1;
  do {
    if ((key->super_SQObject)._type != OT_NULL) {
      NewSlot(this,key,(SQObjectPtr *)(key + -1));
    }
    key = (SQObjectPtr *)((long)(key + 2) + 8);
    uVar2 = uVar2 - 1;
    this_00 = p;
    uVar3 = uVar1;
  } while (uVar2 != 0);
  do {
    SQObjectPtr::~SQObjectPtr(&this_00->key);
    SQObjectPtr::~SQObjectPtr(&this_00->val);
    uVar3 = uVar3 - 1;
    this_00 = this_00 + 1;
  } while (uVar3 != 0);
  sq_vm_free(p,uVar1 * 0x28);
  return;
}

Assistant:

void SQTable::Rehash(bool force)
{
    SQInteger oldsize=_numofnodes;
    //prevent problems with the integer division
    if(oldsize<4)oldsize=4;
    _HashNode *nold=_nodes;
    SQInteger nelems=CountUsed();
    if (nelems >= oldsize-oldsize/4)  /* using more than 3/4? */
        AllocNodes(oldsize*2);
    else if (nelems <= oldsize/4 &&  /* less than 1/4? */
        oldsize > MINPOWER2)
        AllocNodes(oldsize/2);
    else if(force)
        AllocNodes(oldsize);
    else
        return;
    _usednodes = 0;
    for (SQInteger i=0; i<oldsize; i++) {
        _HashNode *old = nold+i;
        if (type(old->key) != OT_NULL)
            NewSlot(old->key,old->val);
    }
    for(SQInteger k=0;k<oldsize;k++)
        nold[k].~_HashNode();
    SQ_FREE(nold,oldsize*sizeof(_HashNode));
}